

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroupCommand.cxx
# Opt level: O0

bool __thiscall
cmSourceGroupCommand::checkArgumentsPreconditions
          (cmSourceGroupCommand *this,ParsedArguments *parsedArguments,string *errorMsg)

{
  bool bVar1;
  bool local_21;
  string *errorMsg_local;
  ParsedArguments *parsedArguments_local;
  cmSourceGroupCommand *this_local;
  
  bVar1 = checkSingleParameterArgumentPreconditions
                    (this,(string *)(anonymous_namespace)::kPrefixOptionName_abi_cxx11_,
                     parsedArguments,errorMsg);
  local_21 = false;
  if (bVar1) {
    bVar1 = checkSingleParameterArgumentPreconditions
                      (this,(string *)(anonymous_namespace)::kTreeOptionName_abi_cxx11_,
                       parsedArguments,errorMsg);
    local_21 = false;
    if (bVar1) {
      local_21 = checkSingleParameterArgumentPreconditions
                           (this,(string *)(anonymous_namespace)::kRegexOptionName_abi_cxx11_,
                            parsedArguments,errorMsg);
    }
  }
  return local_21;
}

Assistant:

bool cmSourceGroupCommand::checkArgumentsPreconditions(
  const ParsedArguments& parsedArguments, std::string& errorMsg) const
{
  return checkSingleParameterArgumentPreconditions(
           kPrefixOptionName, parsedArguments, errorMsg) &&
    checkSingleParameterArgumentPreconditions(kTreeOptionName, parsedArguments,
                                              errorMsg) &&
    checkSingleParameterArgumentPreconditions(kRegexOptionName,
                                              parsedArguments, errorMsg);
}